

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char **new_text_end;
  ImGuiInputTextCallbackData *in_RSI;
  ExampleAppConsole *in_RDI;
  char *history_str;
  int prev_history_pos;
  int i_2;
  int i_1;
  bool all_candidates_matches;
  int c_1;
  int match_len;
  int i;
  ImVector<const_char_*> candidates;
  char c;
  char *word_start;
  char *word_end;
  char **in_stack_fffffffffffffef8;
  ImVector<const_char_*> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char **in_stack_ffffffffffffff38;
  ImGuiInputTextCallbackData *in_stack_ffffffffffffff40;
  int local_60;
  int local_5c;
  int local_54;
  int local_50;
  int local_3c;
  ImVector<const_char_*> local_38;
  char local_21;
  char *local_20;
  char *local_18;
  ImGuiInputTextCallbackData *local_10;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_10 = in_RSI;
  if (in_RSI->EventFlag != 0x40) {
    if (in_RSI->EventFlag != 0x80) {
      return 0;
    }
    iVar1 = in_RDI->HistoryPos;
    if (in_RSI->EventKey == 0x203) {
      if (in_RDI->HistoryPos == -1) {
        in_RDI->HistoryPos = (in_RDI->History).Size + -1;
      }
      else if (0 < in_RDI->HistoryPos) {
        in_RDI->HistoryPos = in_RDI->HistoryPos + -1;
      }
    }
    else if (((in_RSI->EventKey == 0x204) && (in_RDI->HistoryPos != -1)) &&
            (iVar5 = in_RDI->HistoryPos + 1, in_RDI->HistoryPos = iVar5,
            (in_RDI->History).Size <= iVar5)) {
      in_RDI->HistoryPos = -1;
    }
    if (iVar1 == in_RDI->HistoryPos) {
      return 0;
    }
    if (-1 < in_RDI->HistoryPos) {
      ImVector<char_*>::operator[](&in_RDI->History,in_RDI->HistoryPos);
    }
    ImGuiInputTextCallbackData::DeleteChars(local_10,0,local_10->BufTextLen);
    ImGuiInputTextCallbackData::InsertChars
              (in_stack_ffffffffffffff40,iVar4,
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    return 0;
  }
  local_18 = in_RSI->Buf + in_RSI->CursorPos;
  for (local_20 = local_18;
      ((in_RSI->Buf < local_20 && (local_21 = local_20[-1], local_21 != ' ')) &&
      ((local_21 != '\t' && ((local_21 != ',' && (local_21 != ';')))))); local_20 = local_20 + -1) {
  }
  ImVector<const_char_*>::ImVector(&local_38);
  for (local_3c = 0; iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
      local_3c < (in_RDI->Commands).Size; local_3c = local_3c + 1) {
    ImVector<const_char_*>::operator[](&in_RDI->Commands,local_3c);
    iVar4 = Strnicmp(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    if (iVar4 == 0) {
      ImVector<const_char_*>::operator[](&in_RDI->Commands,local_3c);
      ImVector<const_char_*>::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  if (local_38.Size == 0) {
    AddLog(in_RDI,"No match for \"%.*s\"!\n",(ulong)(uint)((int)local_18 - (int)local_20));
  }
  else {
    if (local_38.Size != 1) {
      local_50 = (int)local_18 - (int)local_20;
      do {
        local_54 = 0;
        bVar3 = true;
        local_5c = 0;
        while( true ) {
          iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          bVar2 = false;
          if (local_5c < local_38.Size) {
            bVar2 = bVar3;
          }
          if (!bVar2) break;
          if (local_5c == 0) {
            in_stack_ffffffffffffff40 =
                 (ImGuiInputTextCallbackData *)ImVector<const_char_*>::operator[](&local_38,0);
            local_54 = toupper((int)(*(char **)in_stack_ffffffffffffff40)[local_50]);
          }
          else {
            if (local_54 != 0) {
              in_stack_ffffffffffffff34 = local_54;
              in_stack_ffffffffffffff38 = ImVector<const_char_*>::operator[](&local_38,local_5c);
              iVar4 = toupper((int)(*in_stack_ffffffffffffff38)[local_50]);
              if (in_stack_ffffffffffffff34 == iVar4) goto LAB_0018715d;
            }
            bVar3 = false;
          }
LAB_0018715d:
          local_5c = local_5c + 1;
        }
        if (!bVar3) goto LAB_00187197;
        local_50 = local_50 + 1;
      } while( true );
    }
    ImGuiInputTextCallbackData::DeleteChars
              (local_10,(int)local_20 - *(int *)&local_10->Buf,(int)local_18 - (int)local_20);
    ImVector<const_char_*>::operator[](&local_38,0);
    ImGuiInputTextCallbackData::InsertChars
              (in_stack_ffffffffffffff40,iVar4,
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    ImGuiInputTextCallbackData::InsertChars
              (in_stack_ffffffffffffff40,iVar4,
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
  }
LAB_001872c9:
  ImVector<const_char_*>::~ImVector(in_stack_ffffffffffffff00);
  return 0;
LAB_00187197:
  if (0 < local_50) {
    ImGuiInputTextCallbackData::DeleteChars
              (local_10,(int)local_20 - *(int *)&local_10->Buf,(int)local_18 - (int)local_20);
    new_text_end = ImVector<const_char_*>::operator[](&local_38,0);
    ImVector<const_char_*>::operator[](&local_38,0);
    ImGuiInputTextCallbackData::InsertChars
              (in_stack_ffffffffffffff40,iVar4,
               (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)new_text_end);
  }
  AddLog(in_RDI,"Possible matches:\n");
  for (local_60 = 0; local_60 < local_38.Size; local_60 = local_60 + 1) {
    in_stack_ffffffffffffff00 =
         (ImVector<const_char_*> *)ImVector<const_char_*>::operator[](&local_38,local_60);
    AddLog(in_RDI,"- %s\n",*(char **)in_stack_ffffffffffffff00);
  }
  goto LAB_001872c9;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end - word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end - word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing.
                    data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can..
                    // So inputing "C"+Tab will complete to "CL" then display "CLEAR" and "CLASSIFY" as matches.
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }